

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

bool __thiscall RenX::Server::setUUIDIfDifferent(Server *this,PlayerInfo *player,string_view uuid)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  __y._M_str = (player->uuid)._M_dataplus._M_p;
  __y._M_len = (player->uuid)._M_string_length;
  bVar1 = std::operator==(uuid,__y);
  if (!bVar1) {
    setUUID(this,player,uuid);
  }
  return !bVar1;
}

Assistant:

bool RenX::Server::setUUIDIfDifferent(RenX::PlayerInfo &player, std::string_view uuid) {
	if (player.uuid == uuid) {
		return false;
	}

	setUUID(player, uuid);
	return true;
}